

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nrand.cc
# Opt level: O0

int main(int argc,char **argv)

{
  char *pcVar1;
  bool bVar2;
  int in_EDI;
  ostringstream error_message_9;
  double output;
  ostringstream error_message_8;
  double random;
  int i;
  NormalDistributedRandomValueGeneration generator;
  ostringstream error_message_7;
  ostringstream error_message_6;
  ostringstream error_message_5;
  ostringstream error_message_4;
  double variance;
  ostringstream error_message_3;
  ostringstream error_message_2;
  ostringstream error_message_1;
  ostringstream error_message;
  int option_char;
  double standard_deviation;
  double mean;
  int seed;
  int output_length;
  undefined4 in_stack_ffffffffffffecf8;
  int in_stack_ffffffffffffecfc;
  NormalDistributedRandomValueGeneration *in_stack_ffffffffffffed00;
  allocator *paVar3;
  undefined7 in_stack_ffffffffffffed08;
  undefined1 in_stack_ffffffffffffed0f;
  undefined8 in_stack_ffffffffffffed10;
  ostream *in_stack_ffffffffffffed40;
  bool local_12aa;
  bool local_1282;
  bool local_120a;
  bool local_11e2;
  allocator local_11c1;
  string local_11c0 [32];
  ostringstream local_11a0 [136];
  ostringstream *in_stack_ffffffffffffeee8;
  string *in_stack_ffffffffffffeef0;
  allocator local_1019;
  string local_1018 [32];
  ostringstream local_ff8 [388];
  int local_e74;
  allocator local_e31;
  string local_e30 [32];
  ostringstream local_e10 [383];
  allocator local_c91;
  string local_c90 [32];
  ostringstream local_c70 [383];
  allocator local_af1;
  string local_af0 [32];
  ostringstream local_ad0 [383];
  allocator local_951;
  string local_950 [39];
  allocator local_929;
  string local_928 [32];
  ostringstream local_908 [383];
  allocator local_789;
  string local_788 [32];
  double local_768;
  allocator local_759;
  string local_758 [32];
  ostringstream local_738 [383];
  allocator local_5b9;
  string local_5b8 [39];
  allocator local_591;
  string local_590 [32];
  ostringstream local_570 [383];
  allocator local_3f1;
  string local_3f0 [39];
  allocator local_3c9;
  string local_3c8 [32];
  ostringstream local_3a8 [383];
  allocator local_229;
  string local_228 [39];
  allocator local_201;
  string local_200 [32];
  ostringstream local_1e0 [399];
  allocator local_51;
  string local_50 [36];
  int local_2c;
  double local_28;
  undefined8 local_20;
  undefined4 local_18;
  int local_14;
  int local_8;
  int local_4;
  
  local_4 = 0;
  local_14 = -1;
  local_18 = 1;
  local_20 = 0;
  local_28 = 1.0;
  local_8 = in_EDI;
  while (local_2c = ya_getopt_long((int)((ulong)in_stack_ffffffffffffed10 >> 0x20),
                                   (char **)CONCAT17(in_stack_ffffffffffffed0f,
                                                     in_stack_ffffffffffffed08),
                                   (char *)in_stack_ffffffffffffed00,
                                   (option *)
                                   CONCAT44(in_stack_ffffffffffffecfc,in_stack_ffffffffffffecf8),
                                   (int *)0x103707), pcVar1 = ya_optarg, local_2c != -1) {
    switch(local_2c) {
    case 100:
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_950,pcVar1,&local_951);
      bVar2 = sptk::ConvertStringToDouble
                        ((string *)CONCAT17(in_stack_ffffffffffffed0f,in_stack_ffffffffffffed08),
                         (double *)in_stack_ffffffffffffed00);
      local_12aa = !bVar2 || local_28 < 0.0;
      std::__cxx11::string::~string(local_950);
      std::allocator<char>::~allocator((allocator<char> *)&local_951);
      if (local_12aa) {
        std::__cxx11::ostringstream::ostringstream(local_ad0);
        std::operator<<((ostream *)local_ad0,
                        "The argument for the -d option must be a non-negative number");
        paVar3 = &local_af1;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_af0,"nrand",paVar3);
        sptk::PrintErrorMessage(in_stack_ffffffffffffeef0,in_stack_ffffffffffffeee8);
        std::__cxx11::string::~string(local_af0);
        std::allocator<char>::~allocator((allocator<char> *)&local_af1);
        local_4 = 1;
        std::__cxx11::ostringstream::~ostringstream(local_ad0);
        return local_4;
      }
      break;
    default:
      anon_unknown.dwarf_ca7::PrintUsage(in_stack_ffffffffffffed40);
      return 1;
    case 0x68:
      anon_unknown.dwarf_ca7::PrintUsage(in_stack_ffffffffffffed40);
      return 0;
    case 0x6c:
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_50,pcVar1,&local_51);
      bVar2 = sptk::ConvertStringToInteger
                        ((string *)CONCAT17(in_stack_ffffffffffffed0f,in_stack_ffffffffffffed08),
                         (int *)in_stack_ffffffffffffed00);
      local_11e2 = !bVar2 || local_14 < 1;
      std::__cxx11::string::~string(local_50);
      std::allocator<char>::~allocator((allocator<char> *)&local_51);
      if (local_11e2) {
        std::__cxx11::ostringstream::ostringstream(local_1e0);
        std::operator<<((ostream *)local_1e0,
                        "The argument for the -l option must be a positive integer");
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_200,"nrand",&local_201);
        sptk::PrintErrorMessage(in_stack_ffffffffffffeef0,in_stack_ffffffffffffeee8);
        std::__cxx11::string::~string(local_200);
        std::allocator<char>::~allocator((allocator<char> *)&local_201);
        local_4 = 1;
        std::__cxx11::ostringstream::~ostringstream(local_1e0);
        return local_4;
      }
      break;
    case 0x6d:
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_228,pcVar1,&local_229);
      bVar2 = sptk::ConvertStringToInteger
                        ((string *)CONCAT17(in_stack_ffffffffffffed0f,in_stack_ffffffffffffed08),
                         (int *)in_stack_ffffffffffffed00);
      local_120a = !bVar2 || local_14 < 0;
      std::__cxx11::string::~string(local_228);
      std::allocator<char>::~allocator((allocator<char> *)&local_229);
      if (local_120a) {
        std::__cxx11::ostringstream::ostringstream(local_3a8);
        std::operator<<((ostream *)local_3a8,
                        "The argument for the -m option must be a non-negative integer");
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_3c8,"nrand",&local_3c9);
        sptk::PrintErrorMessage(in_stack_ffffffffffffeef0,in_stack_ffffffffffffeee8);
        std::__cxx11::string::~string(local_3c8);
        std::allocator<char>::~allocator((allocator<char> *)&local_3c9);
        local_4 = 1;
        std::__cxx11::ostringstream::~ostringstream(local_3a8);
        return local_4;
      }
      local_14 = local_14 + 1;
      break;
    case 0x73:
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_3f0,pcVar1,&local_3f1);
      bVar2 = sptk::ConvertStringToInteger
                        ((string *)CONCAT17(in_stack_ffffffffffffed0f,in_stack_ffffffffffffed08),
                         (int *)in_stack_ffffffffffffed00);
      std::__cxx11::string::~string(local_3f0);
      std::allocator<char>::~allocator((allocator<char> *)&local_3f1);
      if (((bVar2 ^ 0xffU) & 1) != 0) {
        std::__cxx11::ostringstream::ostringstream(local_570);
        std::operator<<((ostream *)local_570,"The argument for the -s option must be an integer");
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_590,"nrand",&local_591);
        sptk::PrintErrorMessage(in_stack_ffffffffffffeef0,in_stack_ffffffffffffeee8);
        std::__cxx11::string::~string(local_590);
        std::allocator<char>::~allocator((allocator<char> *)&local_591);
        local_4 = 1;
        std::__cxx11::ostringstream::~ostringstream(local_570);
        return local_4;
      }
      break;
    case 0x75:
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_5b8,pcVar1,&local_5b9);
      bVar2 = sptk::ConvertStringToDouble
                        ((string *)CONCAT17(in_stack_ffffffffffffed0f,in_stack_ffffffffffffed08),
                         (double *)in_stack_ffffffffffffed00);
      std::__cxx11::string::~string(local_5b8);
      std::allocator<char>::~allocator((allocator<char> *)&local_5b9);
      if (((bVar2 ^ 0xffU) & 1) != 0) {
        std::__cxx11::ostringstream::ostringstream(local_738);
        std::operator<<((ostream *)local_738,"The argument for the -u option must be numeric");
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_758,"nrand",&local_759);
        sptk::PrintErrorMessage(in_stack_ffffffffffffeef0,in_stack_ffffffffffffeee8);
        std::__cxx11::string::~string(local_758);
        std::allocator<char>::~allocator((allocator<char> *)&local_759);
        local_4 = 1;
        std::__cxx11::ostringstream::~ostringstream(local_738);
        return local_4;
      }
      break;
    case 0x76:
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_788,pcVar1,&local_789);
      bVar2 = sptk::ConvertStringToDouble
                        ((string *)CONCAT17(in_stack_ffffffffffffed0f,in_stack_ffffffffffffed08),
                         (double *)in_stack_ffffffffffffed00);
      local_1282 = !bVar2 || local_768 < 0.0;
      std::__cxx11::string::~string(local_788);
      std::allocator<char>::~allocator((allocator<char> *)&local_789);
      if (local_1282) {
        std::__cxx11::ostringstream::ostringstream(local_908);
        std::operator<<((ostream *)local_908,
                        "The argument for the -v option must be a non-negative number");
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_928,"nrand",&local_929);
        sptk::PrintErrorMessage(in_stack_ffffffffffffeef0,in_stack_ffffffffffffeee8);
        std::__cxx11::string::~string(local_928);
        std::allocator<char>::~allocator((allocator<char> *)&local_929);
        local_4 = 1;
        std::__cxx11::ostringstream::~ostringstream(local_908);
        return local_4;
      }
      local_28 = sqrt(local_768);
    }
  }
  if (local_8 != ya_optind) {
    std::__cxx11::ostringstream::ostringstream(local_c70);
    std::operator<<((ostream *)local_c70,"Input file is not required");
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_c90,"nrand",&local_c91);
    sptk::PrintErrorMessage(in_stack_ffffffffffffeef0,in_stack_ffffffffffffeee8);
    std::__cxx11::string::~string(local_c90);
    std::allocator<char>::~allocator((allocator<char> *)&local_c91);
    local_4 = 1;
    std::__cxx11::ostringstream::~ostringstream(local_c70);
    return local_4;
  }
  bVar2 = sptk::SetBinaryMode();
  if (!bVar2) {
    std::__cxx11::ostringstream::ostringstream(local_e10);
    std::operator<<((ostream *)local_e10,"Cannot set translation mode");
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_e30,"nrand",&local_e31);
    sptk::PrintErrorMessage(in_stack_ffffffffffffeef0,in_stack_ffffffffffffeee8);
    std::__cxx11::string::~string(local_e30);
    std::allocator<char>::~allocator((allocator<char> *)&local_e31);
    local_4 = 1;
    std::__cxx11::ostringstream::~ostringstream(local_e10);
    return local_4;
  }
  sptk::NormalDistributedRandomValueGeneration::NormalDistributedRandomValueGeneration
            (in_stack_ffffffffffffed00,in_stack_ffffffffffffecfc);
  local_e74 = 0;
  do {
    if (local_14 != -1 && local_14 <= local_e74) {
      local_4 = 0;
LAB_001049bf:
      sptk::NormalDistributedRandomValueGeneration::~NormalDistributedRandomValueGeneration
                ((NormalDistributedRandomValueGeneration *)0x1049cc);
      return local_4;
    }
    bVar2 = sptk::NormalDistributedRandomValueGeneration::Get
                      ((NormalDistributedRandomValueGeneration *)
                       CONCAT17(in_stack_ffffffffffffed0f,in_stack_ffffffffffffed08),
                       (double *)in_stack_ffffffffffffed00);
    if (!bVar2) {
      std::__cxx11::ostringstream::ostringstream(local_ff8);
      std::operator<<((ostream *)local_ff8,"Failed to generate random values");
      paVar3 = &local_1019;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_1018,"nrand",paVar3);
      sptk::PrintErrorMessage(in_stack_ffffffffffffeef0,in_stack_ffffffffffffeee8);
      std::__cxx11::string::~string(local_1018);
      std::allocator<char>::~allocator((allocator<char> *)&local_1019);
      local_4 = 1;
      std::__cxx11::ostringstream::~ostringstream(local_ff8);
      goto LAB_001049bf;
    }
    in_stack_ffffffffffffed0f =
         sptk::WriteStream<double>
                   ((double)CONCAT44(in_stack_ffffffffffffecfc,in_stack_ffffffffffffecf8),
                    (ostream *)0x104869);
    if (!(bool)in_stack_ffffffffffffed0f) {
      std::__cxx11::ostringstream::ostringstream(local_11a0);
      std::operator<<((ostream *)local_11a0,"Failed to write random values");
      paVar3 = &local_11c1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_11c0,"nrand",paVar3);
      sptk::PrintErrorMessage(in_stack_ffffffffffffeef0,in_stack_ffffffffffffeee8);
      std::__cxx11::string::~string(local_11c0);
      std::allocator<char>::~allocator((allocator<char> *)&local_11c1);
      local_4 = 1;
      std::__cxx11::ostringstream::~ostringstream(local_11a0);
      goto LAB_001049bf;
    }
    local_e74 = local_e74 + 1;
  } while( true );
}

Assistant:

int main(int argc, char* argv[]) {
  int output_length(kMagicNumberForInfinity);
  int seed(kDefaultSeed);
  double mean(kDefaultMean);
  double standard_deviation(kDefaultStandardDeviation);

  for (;;) {
    const int option_char(getopt_long(argc, argv, "l:m:s:u:v:d:h", NULL, NULL));
    if (-1 == option_char) break;

    switch (option_char) {
      case 'l': {
        if (!sptk::ConvertStringToInteger(optarg, &output_length) ||
            output_length <= 0) {
          std::ostringstream error_message;
          error_message
              << "The argument for the -l option must be a positive integer";
          sptk::PrintErrorMessage("nrand", error_message);
          return 1;
        }
        break;
      }
      case 'm': {
        if (!sptk::ConvertStringToInteger(optarg, &output_length) ||
            output_length < 0) {
          std::ostringstream error_message;
          error_message << "The argument for the -m option must be a "
                           "non-negative integer";
          sptk::PrintErrorMessage("nrand", error_message);
          return 1;
        }
        ++output_length;
        break;
      }
      case 's': {
        if (!sptk::ConvertStringToInteger(optarg, &seed)) {
          std::ostringstream error_message;
          error_message << "The argument for the -s option must be an integer";
          sptk::PrintErrorMessage("nrand", error_message);
          return 1;
        }
        break;
      }
      case 'u': {
        if (!sptk::ConvertStringToDouble(optarg, &mean)) {
          std::ostringstream error_message;
          error_message << "The argument for the -u option must be numeric";
          sptk::PrintErrorMessage("nrand", error_message);
          return 1;
        }
        break;
      }
      case 'v': {
        double variance;
        if (!sptk::ConvertStringToDouble(optarg, &variance) || variance < 0.0) {
          std::ostringstream error_message;
          error_message
              << "The argument for the -v option must be a non-negative number";
          sptk::PrintErrorMessage("nrand", error_message);
          return 1;
        }
        standard_deviation = std::sqrt(variance);
        break;
      }
      case 'd': {
        if (!sptk::ConvertStringToDouble(optarg, &standard_deviation) ||
            standard_deviation < 0.0) {
          std::ostringstream error_message;
          error_message
              << "The argument for the -d option must be a non-negative number";
          sptk::PrintErrorMessage("nrand", error_message);
          return 1;
        }
        break;
      }
      case 'h': {
        PrintUsage(&std::cout);
        return 0;
      }
      default: {
        PrintUsage(&std::cerr);
        return 1;
      }
    }
  }

  if (0 != argc - optind) {
    std::ostringstream error_message;
    error_message << "Input file is not required";
    sptk::PrintErrorMessage("nrand", error_message);
    return 1;
  }

  if (!sptk::SetBinaryMode()) {
    std::ostringstream error_message;
    error_message << "Cannot set translation mode";
    sptk::PrintErrorMessage("nrand", error_message);
    return 1;
  }

  sptk::NormalDistributedRandomValueGeneration generator(seed);

  for (int i(0); kMagicNumberForInfinity == output_length || i < output_length;
       ++i) {
    double random;
    if (!generator.Get(&random)) {
      std::ostringstream error_message;
      error_message << "Failed to generate random values";
      sptk::PrintErrorMessage("nrand", error_message);
      return 1;
    }
    const double output(mean + random * standard_deviation);
    if (!sptk::WriteStream(output, &std::cout)) {
      std::ostringstream error_message;
      error_message << "Failed to write random values";
      sptk::PrintErrorMessage("nrand", error_message);
      return 1;
    }
  }

  return 0;
}